

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O2

void connection_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  void *__ptr;
  undefined8 uVar2;
  char *pcVar3;
  
  __ptr = handle->data;
  piVar1 = (int *)((long)__ptr + 0x154);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    if (*(int *)((long)__ptr + 0x150) == 0) {
      if (*(long *)((long)__ptr + 0x140) != 0) {
        pcVar3 = "context->read == 0";
        uVar2 = 0xb8;
        goto LAB_0014929d;
      }
LAB_0014923a:
      if (*(long *)((long)__ptr + 0x148) == 0x10000) {
LAB_00149247:
        closed_connections = closed_connections + 1;
        free(__ptr);
        return;
      }
      pcVar3 = "context->sent == TRANSFER_BYTES";
      uVar2 = 0xbc;
      goto LAB_0014929d;
    }
    if (*(long *)((long)__ptr + 0x140) == 0x10000) {
      if (*(long *)((long)__ptr + 0x148) != 0) {
        pcVar3 = "context->sent == 0";
        uVar2 = 0xbe;
        goto LAB_0014929d;
      }
      goto LAB_00149247;
    }
  }
  else if (*(long *)((long)__ptr + 0x140) == 0x10000) goto LAB_0014923a;
  pcVar3 = "context->read == TRANSFER_BYTES";
  uVar2 = 0xb6;
LAB_0014929d:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/test-poll.c",
          uVar2,pcVar3);
  abort();
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT(context->read == TRANSFER_BYTES);
    } else {
      ASSERT(context->read == 0);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT(context->sent == TRANSFER_BYTES);
    } else {
      ASSERT(context->sent == 0);
    }

    closed_connections++;

    free(context);
  }
}